

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O3

Slice __thiscall arangodb::velocypack::ObjectIterator::key(ObjectIterator *this,bool translate)

{
  Slice SVar1;
  ulong uVar2;
  byte *start;
  Slice s;
  byte *pbStack_20;
  uint8_t *local_8;
  
  if (this->_position == this->_size) {
    key();
    SVar1._start = (uint8_t *)this->_position;
    if (SVar1._start != (uint8_t *)this->_size) {
      SVar1._start = SVar1._start + 1;
      this->_position = (ValueLength)SVar1._start;
      pbStack_20 = this->_current;
      if (pbStack_20 != (byte *)0x0) {
        uVar2 = (ulong)"\x01\x01"[*pbStack_20];
        if (uVar2 == 0) {
          uVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&pbStack_20,pbStack_20);
          pbStack_20 = this->_current;
        }
        start = pbStack_20 + uVar2;
        this->_current = start;
        SVar1._start = (uint8_t *)(ulong)"\x01\x01"[pbStack_20[uVar2]];
        if (SVar1._start == (uint8_t *)0x0) {
          pbStack_20 = start;
          SVar1._start = (uint8_t *)
                         SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                         byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                          *)&pbStack_20,start);
          start = this->_current;
        }
        this->_current = start + (long)SVar1._start;
      }
    }
    return (Slice)SVar1._start;
  }
  local_8 = this->_current;
  if (local_8 != (uint8_t *)0x0) {
    if (translate) {
      local_8 = (uint8_t *)
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_8);
    }
    return (Slice)local_8;
  }
  SVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getNthKey
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this,
                     this->_position,translate);
  return (Slice)SVar1._start;
}

Assistant:

[[nodiscard]] Slice key(bool translate = true) const {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      throw Exception{Exception::IndexOutOfBounds};
    }
    if (_current != nullptr) {
      Slice s{_current};
      return translate ? s.makeKey() : s;
    }
    return _slice.getNthKey(_position, translate);
  }